

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder-helper.c
# Opt level: O3

int tlv_check_type_length(uint8_t *buf,size_t buflen,uint32_t type)

{
  int iVar1;
  ulong in_RAX;
  uint8_t *puVar2;
  undefined8 local_28;
  uint32_t real_type;
  uint32_t real_len;
  
  if (buf == (uint8_t *)0x0) {
    return -0x10;
  }
  local_28 = in_RAX;
  puVar2 = tlv_get_type_length(buf,buflen,(uint32_t *)&local_28,(uint32_t *)((long)&local_28 + 4));
  if (puVar2 == (uint8_t *)0x0) {
    iVar1 = -0xe;
  }
  else {
    iVar1 = -0xc;
    if (((uint32_t)local_28 == type) &&
       (iVar1 = -0xd, buf + (buflen - (long)puVar2) == (uint8_t *)(local_28 >> 0x20))) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
tlv_check_type_length(uint8_t* buf, size_t buflen, uint32_t type){
  uint32_t real_type, real_len;
  uint8_t* ptr;

  if(buf == NULL){
    return NDN_INVALID_POINTER;
  }
  ptr = tlv_get_type_length(buf, buflen, &real_type, &real_len);
  if(ptr == NULL){
    return NDN_OVERSIZE_VAR;
  }
  if(real_type != type){
    return NDN_WRONG_TLV_TYPE;
  }
  if(real_len != buflen - (ptr - buf)){
    return NDN_WRONG_TLV_LENGTH;
  }
  return NDN_SUCCESS;
}